

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingBar::IfcReinforcingBar(IfcReinforcingBar *this)

{
  *(undefined ***)&this->field_0x208 = &PTR__Object_007261d0;
  *(undefined8 *)&this->field_0x210 = 0;
  *(char **)&this->field_0x218 = "IfcReinforcingBar";
  Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            (&this->super_IfcReinforcingElement,&PTR_construction_vtable_24__00760608);
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x198 = 0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x760488;
  *(undefined8 *)&this->field_0x208 = 0x7605f0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x7604b0;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x7604d8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x760500;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x760528;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0x760550;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x760578;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = 0x7605a0;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x190 = 0x7605c8;
  (this->BarLength).have = false;
  (this->BarRole)._M_dataplus._M_p = (pointer)&(this->BarRole).field_2;
  (this->BarRole)._M_string_length = 0;
  (this->BarRole).field_2._M_local_buf[0] = '\0';
  (this->BarSurface).ptr._M_dataplus._M_p = (pointer)&(this->BarSurface).ptr.field_2;
  (this->BarSurface).ptr._M_string_length = 0;
  (this->BarSurface).ptr.field_2._M_local_buf[0] = '\0';
  (this->BarSurface).have = false;
  return;
}

Assistant:

IfcReinforcingBar() : Object("IfcReinforcingBar") {}